

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O0

void __thiscall re2::DFA::DFA(DFA *this,Prog *prog,MatchKind kind,int64 max_mem)

{
  undefined1 auVar1 [16];
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  ostream *poVar6;
  Workq *pWVar7;
  ulong uVar8;
  int *piVar9;
  long lVar10;
  StartInfo *local_3a8;
  string local_388 [32];
  LogMessage local_368;
  long local_1e8;
  int64 one_state;
  string local_1d8 [4];
  int nnext;
  LogMessage local_1b8;
  int local_38;
  int nmark;
  int64 local_28;
  int64 max_mem_local;
  Prog *pPStack_18;
  MatchKind kind_local;
  Prog *prog_local;
  DFA *this_local;
  
  this->prog_ = prog;
  this->kind_ = kind;
  this->init_failed_ = false;
  local_28 = max_mem;
  max_mem_local._4_4_ = kind;
  pPStack_18 = prog;
  prog_local = (Prog *)this;
  Mutex::Mutex(&this->mutex_);
  this->q0_ = (Workq *)0x0;
  this->q1_ = (Workq *)0x0;
  this->astack_ = (int *)0x0;
  Mutex::Mutex(&this->cache_mutex_);
  this->mem_budget_ = local_28;
  std::
  unordered_set<re2::DFA::State_*,_re2::DFA::StateHash,_re2::DFA::StateEqual,_std::allocator<re2::DFA::State_*>_>
  ::unordered_set(&this->state_cache_);
  local_3a8 = this->start_;
  do {
    StartInfo::StartInfo(local_3a8);
    local_3a8 = local_3a8 + 1;
  } while (local_3a8 != (StartInfo *)&this->cache_warned_);
  this->cache_warned_ = false;
  local_38 = 0;
  if (this->kind_ == kLongestMatch) {
    local_38 = Prog::size(this->prog_);
  }
  iVar2 = Prog::inst_count(this->prog_,kInstCapture);
  iVar3 = Prog::inst_count(this->prog_,kInstEmptyWidth);
  iVar4 = Prog::inst_count(this->prog_,kInstNop);
  this->nastack_ = local_38 + 1 + iVar2 + iVar3 + iVar4;
  this->mem_budget_ = this->mem_budget_ + -0x170;
  iVar2 = Prog::size(this->prog_);
  this->mem_budget_ = this->mem_budget_ + (long)(iVar2 + local_38) * -0x10;
  this->mem_budget_ = this->mem_budget_ + (long)this->nastack_ * -4;
  if (this->mem_budget_ < 0) {
    LogMessage::LogMessage
              (&local_1b8,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/dfa.cc",0x1c9,0
              );
    poVar6 = LogMessage::stream(&local_1b8);
    uVar5 = Prog::size(this->prog_);
    StringPrintf_abi_cxx11_
              ((char *)local_1d8,"DFA out of memory: prog size %d mem %lld",(ulong)uVar5,local_28);
    std::operator<<(poVar6,local_1d8);
    std::__cxx11::string::~string(local_1d8);
    LogMessage::~LogMessage(&local_1b8);
    this->init_failed_ = true;
  }
  else {
    this->state_budget_ = this->mem_budget_;
    iVar2 = Prog::bytemap_range(this->prog_);
    one_state._4_4_ = iVar2 + 1;
    lVar10 = (long)one_state._4_4_;
    iVar2 = Prog::list_count(this->prog_);
    local_1e8 = lVar10 * 8 + 0x10 + (long)(iVar2 + local_38) * 4;
    if (SBORROW8(this->state_budget_,local_1e8 * 0x14) ==
        this->state_budget_ + local_1e8 * -0x14 < 0) {
      pWVar7 = (Workq *)operator_new(0x28);
      iVar2 = Prog::size(this->prog_);
      Workq::Workq(pWVar7,iVar2,local_38);
      this->q0_ = pWVar7;
      pWVar7 = (Workq *)operator_new(0x28);
      iVar2 = Prog::size(this->prog_);
      Workq::Workq(pWVar7,iVar2,local_38);
      this->q1_ = pWVar7;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = (long)this->nastack_;
      uVar8 = SUB168(auVar1 * ZEXT816(4),0);
      if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
        uVar8 = 0xffffffffffffffff;
      }
      piVar9 = (int *)operator_new__(uVar8);
      this->astack_ = piVar9;
    }
    else {
      LogMessage::LogMessage
                (&local_368,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/dfa.cc",0x1db
                 ,0);
      poVar6 = LogMessage::stream(&local_368);
      uVar5 = Prog::size(this->prog_);
      StringPrintf_abi_cxx11_
                ((char *)local_388,"DFA out of memory: prog size %d mem %lld",(ulong)uVar5,local_28)
      ;
      std::operator<<(poVar6,local_388);
      std::__cxx11::string::~string(local_388);
      LogMessage::~LogMessage(&local_368);
      this->init_failed_ = true;
    }
  }
  return;
}

Assistant:

DFA::DFA(Prog* prog, Prog::MatchKind kind, int64 max_mem)
  : prog_(prog),
    kind_(kind),
    init_failed_(false),
    q0_(NULL),
    q1_(NULL),
    astack_(NULL),
    mem_budget_(max_mem),
    cache_warned_(false) {
  if (DebugDFA)
    fprintf(stderr, "\nkind %d\n%s\n", (int)kind_, prog_->DumpUnanchored().c_str());
  int nmark = 0;
  if (kind_ == Prog::kLongestMatch)
    nmark = prog_->size();
  // See DFA::AddToQueue() for why this is so.
  nastack_ = prog_->inst_count(kInstCapture) +
             prog_->inst_count(kInstEmptyWidth) +
             prog_->inst_count(kInstNop) +
             nmark + 1;  // + 1 for start inst

  // Account for space needed for DFA, q0, q1, astack.
  mem_budget_ -= sizeof(DFA);
  mem_budget_ -= (prog_->size() + nmark) *
                 (sizeof(int)+sizeof(int)) * 2;  // q0, q1
  mem_budget_ -= nastack_ * sizeof(int);  // astack
  if (mem_budget_ < 0) {
    LOG(INFO) << StringPrintf("DFA out of memory: prog size %d mem %lld",
                              prog_->size(), max_mem);
    init_failed_ = true;
    return;
  }

  state_budget_ = mem_budget_;

  // Make sure there is a reasonable amount of working room left.
  // At minimum, the search requires room for two states in order
  // to limp along, restarting frequently.  We'll get better performance
  // if there is room for a larger number of states, say 20.
  // Note that a state stores list heads only, so we use the program
  // list count for the upper bound, not the program size.
  int nnext = prog_->bytemap_range() + 1;  // + 1 for kByteEndText slot
  int64 one_state = sizeof(State) + nnext*sizeof(std::atomic<State*>) +
                    (prog_->list_count()+nmark)*sizeof(int);
  if (state_budget_ < 20*one_state) {
    LOG(INFO) << StringPrintf("DFA out of memory: prog size %d mem %lld",
                              prog_->size(), max_mem);
    init_failed_ = true;
    return;
  }

  q0_ = new Workq(prog_->size(), nmark);
  q1_ = new Workq(prog_->size(), nmark);
  astack_ = new int[nastack_];
}